

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

float memory_tree_ns::train_node(memory_tree *b,single_learner *base,example *ec,uint32_t cn)

{
  polylabel *ppVar1;
  polyprediction *ppVar2;
  uint64_t *puVar3;
  float fVar4;
  float fVar5;
  uint32_t uVar6;
  node *pnVar7;
  double dVar8;
  uint64_t uVar9;
  labels preds;
  labels multilabels;
  float local_94;
  label_t local_88;
  float *local_78;
  float *pfStack_70;
  float *local_68;
  size_t sStack_60;
  label_t local_58;
  wclass *pwStack_50;
  wclass *local_48;
  size_t sStack_40;
  
  ppVar1 = &ec->l;
  ppVar2 = &ec->pred;
  if (b->oas == 0) {
    local_88 = ppVar1->multi;
    local_94 = ppVar2->scalar;
  }
  else {
    local_58 = ppVar1->multi;
    pwStack_50 = (ec->l).cs.costs._end;
    local_48 = (ec->l).cs.costs.end_array;
    sStack_40 = (ec->l).cs.costs.erase_count;
    local_78 = (ppVar2->scalars)._begin;
    pfStack_70 = (ec->pred).scalars._end;
    local_68 = (ec->pred).scalars.end_array;
    sStack_60 = (ec->pred).scalars.erase_count;
    local_94 = 0.0;
  }
  (ec->l).cs.costs._begin = (wclass *)0x3f8000003f800000;
  (ec->l).simple.initial = 0.0;
  uVar6 = (b->nodes)._begin[cn].base_router;
  puVar3 = &(ec->super_example_predict).ft_offset;
  *puVar3 = *puVar3 + (ulong)(*(int *)(base + 0xe0) * uVar6);
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  puVar3 = &(ec->super_example_predict).ft_offset;
  *puVar3 = *puVar3 - (ulong)(uVar6 * *(int *)(base + 0xe0));
  fVar4 = (ec->pred).scalar;
  fVar5 = b->alpha;
  pnVar7 = (b->nodes)._begin;
  dVar8 = log(pnVar7[cn].nl / (pnVar7[cn].nr + 0.1));
  fVar4 = *(float *)(&DAT_0027fe28 +
                    (ulong)((float)((double)(fVar4 * b->alpha) +
                                   (dVar8 * (1.0 - (double)fVar5)) / 0.6931471805599453) < 0.0) * 4)
  ;
  fVar5 = ec->weight;
  ec->weight = 1.0;
  (ec->l).simple.label = fVar4;
  *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0x3f800000;
  uVar6 = (b->nodes)._begin[cn].base_router;
  puVar3 = &(ec->super_example_predict).ft_offset;
  *puVar3 = *puVar3 + (ulong)(*(int *)(base + 0xe0) * uVar6);
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  uVar9 = (ec->super_example_predict).ft_offset - (ulong)(uVar6 * *(int *)(base + 0xe0));
  (ec->super_example_predict).ft_offset = uVar9;
  uVar6 = (b->nodes)._begin[cn].base_router;
  (ec->super_example_predict).ft_offset = *(int *)(base + 0xe0) * uVar6 + uVar9;
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
  puVar3 = &(ec->super_example_predict).ft_offset;
  *puVar3 = *puVar3 - (ulong)(uVar6 * *(int *)(base + 0xe0));
  fVar4 = (ec->pred).scalar;
  if (b->oas == 0) {
    ppVar1->multi = local_88;
    ppVar2->scalar = local_94;
  }
  else {
    (ec->pred).scalars.end_array = local_68;
    (ec->pred).scalars.erase_count = sStack_60;
    (ppVar2->scalars)._begin = local_78;
    (ec->pred).scalars._end = pfStack_70;
    (ec->l).cs.costs.end_array = local_48;
    (ec->l).cs.costs.erase_count = sStack_40;
    ppVar1->multi = local_58;
    (ec->l).cs.costs._end = pwStack_50;
  }
  ec->weight = fVar5;
  return fVar4;
}

Assistant:

float train_node(memory_tree& b, single_learner& base, example& ec, const uint32_t cn)
    {
        //predict, learn and predict
        //note: here we first train the router and then predict.
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas == false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }

        ec.l.simple = {1.f, 1.f, 0.};
        base.predict(ec, b.nodes[cn].base_router);
        float prediction = ec.pred.scalar; 
	    //float imp_weight = 1.f; //no importance weight.
        
        float weighted_value = (1.-b.alpha)*log(b.nodes[cn].nl/(b.nodes[cn].nr+1e-1))/log(2.)+b.alpha*prediction;
        float route_label = weighted_value < 0.f ? -1.f : 1.f;
        
        //ec.l.simple = {route_label, imp_weight, 0.f}; 
        float ec_input_weight = ec.weight;
        ec.weight = 1.f;
	    ec.l.simple = {route_label, 1., 0.f};
        base.learn(ec, b.nodes[cn].base_router); //update the router according to the new example.
        
        base.predict(ec, b.nodes[cn].base_router);
        float save_binary_scalar = ec.pred.scalar;

        if(b.oas == false){
            ec.l.multi = mc;
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds;
            ec.l.multilabels = multilabels;
        }
        ec.weight = ec_input_weight;

        return save_binary_scalar;
    }